

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedFloatType<double>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedFloatType<double> min,WrappedFloatType<double> max,float gridSize)

{
  double dVar1;
  WrappedFloatType<double> WVar2;
  double dVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  uint uVar12;
  float fVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double in_XMM7_Qa;
  WrappedFloatType<double> in_XMM8_Qa;
  WrappedFloatType<double> local_c8;
  int local_bc;
  double local_b8;
  WrappedFloatType<double> minDiff;
  double local_98;
  double local_50;
  double local_48;
  deRandom rnd;
  
  local_b8 = (double)CONCAT44(local_b8._4_4_,gridSize);
  iVar4 = componentCount * 8;
  if (stride != 0) {
    iVar4 = stride;
  }
  local_bc = iVar4 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    local_bc = 0;
  }
  pcVar5 = (char *)operator_new__((long)(local_bc * count + offset));
  deRandom_init(&rnd,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar13 = (float)max.m_value - (float)min.m_value;
    uVar12 = -(uint)(-fVar13 <= fVar13);
    fVar13 = (float)(~uVar12 & (uint)-fVar13 | (uint)fVar13 & uVar12) * local_b8._0_4_;
    dVar1 = (double)fVar13;
    minDiff.m_value = 4.0;
    if (4.0 <= fVar13) {
      minDiff.m_value = dVar1;
    }
    if (count < 1) {
      count = 0;
    }
    iVar7 = 0x10;
    iVar9 = 0x18;
    for (uVar8 = 0; uVar8 != (uint)count; uVar8 = uVar8 + 1) {
      iVar10 = 4;
      dVar3 = dVar1;
      do {
        bVar11 = iVar10 == 0;
        iVar10 = iVar10 + -1;
        dVar1 = dVar3;
        if (bVar11) break;
        local_c8.m_value =
             (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                               (&rnd,min.m_value,max.m_value);
        local_48 = (double)roundTo<deqp::gls::GLValue::WrappedFloatType<double>>(&minDiff,&local_c8)
        ;
        local_c8.m_value =
             (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                               (&rnd,minDiff.m_value,(double)ABS((float)(max.m_value - local_48)));
        local_b8 = (double)roundTo<deqp::gls::GLValue::WrappedFloatType<double>>(&minDiff,&local_c8)
        ;
        local_c8.m_value =
             (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                               (&rnd,min.m_value,max.m_value);
        local_50 = (double)roundTo<deqp::gls::GLValue::WrappedFloatType<double>>(&minDiff,&local_c8)
        ;
        local_c8.m_value =
             (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                               (&rnd,minDiff.m_value,(double)ABS((float)(max.m_value - local_50)));
        local_98 = (double)roundTo<deqp::gls::GLValue::WrappedFloatType<double>>(&minDiff,&local_c8)
        ;
        if (componentCount < 3) {
          in_XMM8_Qa.m_value = 0.0;
          dVar1 = 1.0;
          in_XMM7_Qa = local_b8;
          break;
        }
        local_c8.m_value =
             (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                               (&rnd,min.m_value,max.m_value);
        in_XMM8_Qa = roundTo<deqp::gls::GLValue::WrappedFloatType<double>>(&minDiff,&local_c8);
        uVar14 = 0;
        uVar15 = 0x3ff00000;
        if (componentCount != 3) {
          local_c8.m_value =
               (double)getRandom<deqp::gls::GLValue::WrappedFloatType<double>>
                                 (&rnd,min.m_value,max.m_value);
          WVar2 = roundTo<deqp::gls::GLValue::WrappedFloatType<double>>(&minDiff,&local_c8);
          uVar14 = SUB84(WVar2.m_value,0);
          uVar15 = (undefined4)((ulong)WVar2.m_value >> 0x20);
        }
        dVar1 = (double)CONCAT44(uVar15,uVar14);
        fVar13 = (float)in_XMM8_Qa.m_value + (float)local_b8;
        uVar12 = -(uint)(-fVar13 <= fVar13);
        in_XMM7_Qa = local_b8;
        dVar3 = (double)CONCAT44(uVar15,uVar14);
      } while (((float)(~uVar12 & (uint)-fVar13 | (uint)fVar13 & uVar12) < (float)minDiff.m_value)
              || (fVar13 = (float)(double)CONCAT44(uVar15,uVar14) + (float)local_98,
                 uVar12 = -(uint)(-fVar13 <= fVar13), dVar3 = dVar1,
                 (float)(~uVar12 & (uint)-fVar13 | (uint)fVar13 & uVar12) < (float)minDiff.m_value))
      ;
      iVar10 = local_bc * (int)uVar8;
      *(double *)(pcVar5 + (long)iVar10 + (long)offset) = local_48;
      *(double *)(pcVar5 + (long)(iVar10 + 8) + (long)offset) = local_50;
      dVar3 = local_48 + in_XMM7_Qa;
      *(double *)(pcVar5 + (long)(iVar10 + iVar4) + (long)offset) = dVar3;
      *(double *)(pcVar5 + (long)(iVar10 + 8 + iVar4) + (long)offset) = local_50;
      *(double *)(pcVar5 + (long)(iVar10 + iVar4 * 2) + (long)offset) = local_48;
      dVar16 = local_50 + local_98;
      *(double *)(pcVar5 + (long)(iVar10 + 8 + iVar4 * 2) + (long)offset) = dVar16;
      *(double *)(pcVar5 + (long)(iVar10 + iVar4 * 3) + (long)offset) = local_48;
      *(double *)(pcVar5 + (long)(iVar10 + 8 + iVar4 * 3) + (long)offset) = dVar16;
      *(double *)(pcVar5 + (long)(iVar10 + iVar4 * 4) + (long)offset) = dVar3;
      *(double *)(pcVar5 + (long)(iVar10 + 8 + iVar4 * 4) + (long)offset) = local_50;
      *(double *)(pcVar5 + (long)(iVar10 + iVar4 * 5) + (long)offset) = dVar3;
      *(double *)(pcVar5 + (long)(iVar10 + iVar4 * 5 + 8) + (long)offset) = dVar16;
      if (2 < componentCount) {
        lVar6 = 6;
        iVar10 = iVar7;
        while (bVar11 = lVar6 != 0, lVar6 = lVar6 + -1, bVar11) {
          *(double *)(pcVar5 + (long)iVar10 + (long)offset) = in_XMM8_Qa.m_value;
          iVar10 = iVar10 + iVar4;
        }
        if (componentCount != 3) {
          lVar6 = 6;
          iVar10 = iVar9;
          while (bVar11 = lVar6 != 0, lVar6 = lVar6 + -1, bVar11) {
            *(double *)(pcVar5 + (long)iVar10 + (long)offset) = dVar1;
            iVar10 = iVar10 + iVar4;
          }
        }
      }
      iVar7 = iVar7 + local_bc;
      iVar9 = iVar9 + local_bc;
    }
  }
  return pcVar5;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}